

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::Compilation::resolveDefParamsAndBinds()::BindEntry>::
emplace_back<slang::ast::Compilation::resolveDefParamsAndBinds()::BindEntry>
          (SmallVectorBase<BindEntry> *this,BindEntry *args)

{
  SmallVectorBase<BindEntry> *in_RDI;
  BindEntry *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<BindEntry> *in_stack_00000030;
  BindEntry *in_stack_ffffffffffffffd8;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<BindEntry>::end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::Compilation::resolveDefParamsAndBinds()::BindEntry>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    SmallVectorBase<BindEntry>::end(in_RDI);
    slang::ast::Compilation::resolveDefParamsAndBinds::BindEntry::BindEntry
              ((BindEntry *)in_RDI,in_stack_ffffffffffffffd8);
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<BindEntry>::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }